

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_rep(lua_State *L)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *__src;
  ulong uVar3;
  char *__src_00;
  char *__dest;
  long lVar4;
  size_t sz;
  size_t l;
  size_t lsep;
  luaL_Buffer b;
  ulong local_460;
  ulong local_458;
  luaL_Buffer local_450;
  
  iVar2 = 1;
  __src = luaL_checklstring(L,1,&local_460);
  uVar3 = luaL_checkinteger(L,2);
  __src_00 = luaL_optlstring(L,3,"",&local_458);
  if ((long)uVar3 < 1) {
    lua_pushstring(L,"");
  }
  else if ((CARRY8(local_460,local_458)) ||
          (auVar1._8_8_ = 0, auVar1._0_8_ = uVar3,
          SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar1,0) <
          local_460 + local_458)) {
    iVar2 = luaL_error(L,"resulting string too large");
  }
  else {
    sz = (local_460 + local_458) * uVar3 - local_458;
    __dest = luaL_buffinitsize(L,&local_450,sz);
    if (uVar3 != 1) {
      lVar4 = uVar3 + 1;
      do {
        memcpy(__dest,__src,local_460);
        __dest = __dest + local_460;
        if (local_458 != 0) {
          memcpy(__dest,__src_00,local_458);
          __dest = __dest + local_458;
        }
        lVar4 = lVar4 + -1;
      } while (2 < lVar4);
    }
    memcpy(__dest,__src,local_460);
    luaL_pushresultsize(&local_450,sz);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int str_rep (lua_State *L) {
  size_t l, lsep;
  const char *s = luaL_checklstring(L, 1, &l);
  lua_Integer n = luaL_checkinteger(L, 2);
  const char *sep = luaL_optlstring(L, 3, "", &lsep);
  if (n <= 0)
    lua_pushliteral(L, "");
  else if (l_unlikely(l + lsep < l || l + lsep > MAX_SIZE / cast_sizet(n)))
    return luaL_error(L, "resulting string too large");
  else {
    size_t totallen = ((size_t)n * (l + lsep)) - lsep;
    luaL_Buffer b;
    char *p = luaL_buffinitsize(L, &b, totallen);
    while (n-- > 1) {  /* first n-1 copies (followed by separator) */
      memcpy(p, s, l * sizeof(char)); p += l;
      if (lsep > 0) {  /* empty 'memcpy' is not that cheap */
        memcpy(p, sep, lsep * sizeof(char));
        p += lsep;
      }
    }
    memcpy(p, s, l * sizeof(char));  /* last copy (not followed by separator) */
    luaL_pushresultsize(&b, totallen);
  }
  return 1;
}